

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::QualifiedClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *d)

{
  Options *in_RCX;
  undefined1 *local_120;
  undefined8 local_118;
  undefined1 local_110 [16];
  undefined1 local_100;
  undefined1 local_fe;
  undefined8 local_fd;
  undefined4 local_f5;
  undefined1 local_f1;
  undefined1 *local_e8;
  undefined1 local_d8 [24];
  undefined1 *local_c0;
  undefined1 local_b0 [16];
  undefined1 *local_a0;
  undefined1 local_90 [24];
  undefined4 local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined1 local_38;
  
  memset(local_110,0,0xe0);
  local_118 = 0;
  local_100 = 0;
  local_fe = 1;
  local_fd = 0;
  local_f5 = 0;
  local_f1 = 1;
  local_e8 = local_d8;
  local_d8[0] = 0;
  local_b0[0] = 0;
  local_90[0] = 0;
  local_78 = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38 = 0;
  local_120 = local_110;
  local_c0 = local_b0;
  local_a0 = local_90;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  QualifiedClassName_abi_cxx11_(__return_storage_ptr__,this,(Descriptor *)&local_120,in_RCX);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_68);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_120 != local_110) {
    operator_delete(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedClassName(const Descriptor* d) {
  return QualifiedClassName(d, Options());
}